

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::primary_expr(analysis *this)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TYPE TVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  analysis *in_RSI;
  undefined8 uVar7;
  TreeNode *__tmp;
  TreeNode *__tmp_2;
  float fVar8;
  NodePtr NVar9;
  int lineno;
  string tmp_str;
  int tmp_int;
  undefined1 local_11d;
  int local_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_11c = token::getLineno((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == NUMINT) {
    iVar5 = numberInteger(in_RSI);
    local_f8._0_4_ = iVar5;
    local_118._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,int&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
               (allocator<dh::TreeNode> *)&local_11d,(int *)local_f8,&local_11c);
    uVar3 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ = (TreeNode *)0x0;
    uVar2 = local_118._0_8_;
    local_118._8_8_ = (element_type *)0x0;
    local_118._0_4_ = (undefined4)uVar7;
    local_118[4] = SUB81(uVar7,4);
    local_118._5_3_ = SUB83(uVar7,5);
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    peVar1 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_118._0_8_ = uVar2;
    if (peVar1 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
    }
    if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    local_118._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar7,(int *)local_118);
    local_118._0_4_ = 0xb;
    TreeNode::setKind((TreeNode *)uVar7,(int *)local_118);
    local_118._0_4_ = 2;
    TreeNode::setType((TreeNode *)uVar7,(int *)local_118);
    _Var6._M_pi = extraout_RDX;
    goto LAB_0011765c;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == NUMFLOAT) {
    fVar8 = numberFloat(in_RSI);
    local_f8._0_4_ = fVar8;
    local_118._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,float&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
               (allocator<dh::TreeNode> *)&local_11d,(float *)local_f8,&local_11c);
    uVar3 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ = (TreeNode *)0x0;
    uVar2 = local_118._0_8_;
    local_118._8_8_ = (element_type *)0x0;
    local_118._0_4_ = (undefined4)uVar7;
    local_118[4] = SUB81(uVar7,4);
    local_118._5_3_ = SUB83(uVar7,5);
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    peVar1 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_118._0_8_ = uVar2;
    if (peVar1 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
    }
    if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    local_118._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar7,(int *)local_118);
    local_118._0_4_ = 0xc;
    TreeNode::setKind((TreeNode *)uVar7,(int *)local_118);
    local_118._0_4_ = 3;
    TreeNode::setType((TreeNode *)uVar7,(int *)local_118);
    _Var6._M_pi = extraout_RDX_00;
    goto LAB_0011765c;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if ((TVar4 == NUMBOOLEAN) ||
     (TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), TVar4 == STRING)) {
    token::getVal_abi_cxx11_
              ((string *)local_118,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_f8._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),(TreeNode **)local_f8,
               (allocator<dh::TreeNode> *)&local_11d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_11c);
    uVar3 = local_f8._8_8_;
    uVar7 = local_f8._0_8_;
    local_f8._0_8_ = (TreeNode *)0x0;
    uVar2 = local_f8._0_8_;
    local_f8._8_8_ = (element_type *)0x0;
    local_f8._0_4_ = (undefined4)uVar7;
    local_f8[4] = SUB81(uVar7,4);
    local_f8._5_3_ = SUB83(uVar7,5);
    this->layer_record = local_f8._0_4_;
    this->initFlag = (bool)local_f8[4];
    *(undefined3 *)&this->field_0x5 = local_f8._5_3_;
    peVar1 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_f8._0_8_ = uVar2;
    if (peVar1 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
    }
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar4 == NUMBOOLEAN) {
      local_118._0_8_ = (ulong)(uint)local_118._4_4_ << 0x20;
      TreeNode::setType((TreeNode *)uVar7,(int *)local_118);
      local_118._0_4_ = 0xd;
      TreeNode::setKind((TreeNode *)uVar7,(int *)local_118);
    }
    else {
      local_118._0_4_ = 1;
      TreeNode::setType((TreeNode *)uVar7,(int *)local_118);
      local_118._0_4_ = 0xe;
      TreeNode::setKind((TreeNode *)uVar7,(int *)local_118);
    }
    token::getVal_abi_cxx11_
              (&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_118._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar7,(int *)local_118);
    _Var6._M_pi = extraout_RDX_01;
    goto LAB_0011765c;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == ID) {
    identifier_abi_cxx11_((string *)local_118,in_RSI);
    local_f8._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),(TreeNode **)local_f8,
               (allocator<dh::TreeNode> *)&local_11d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_11c);
    uVar3 = local_f8._8_8_;
    uVar7 = local_f8._0_8_;
    local_f8._0_8_ = (TreeNode *)0x0;
    uVar2 = local_f8._0_8_;
    local_f8._8_8_ = (element_type *)0x0;
    local_f8._0_4_ = (undefined4)uVar7;
    local_f8[4] = SUB81(uVar7,4);
    local_f8._5_3_ = SUB83(uVar7,5);
    this->layer_record = local_f8._0_4_;
    this->initFlag = (bool)local_f8[4];
    *(undefined3 *)&this->field_0x5 = local_f8._5_3_;
    peVar1 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_f8._0_8_ = uVar2;
    if (peVar1 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
    }
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    local_f8._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar7,(int *)local_f8);
    token::getVal_abi_cxx11_
              ((string *)local_f8,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar5 = std::__cxx11::string::compare(local_f8);
    if ((TreeNode *)local_f8._0_8_ != (TreeNode *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    if (iVar5 == 0) {
      local_70.field_2._M_allocated_capacity._0_2_ = 0x5b;
      local_70._M_string_length = 1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      match(in_RSI,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_f8._0_4_ = 8;
      TreeNode::setKind((TreeNode *)uVar7,(int *)local_f8);
      assignment_expr((analysis *)local_f8);
      local_90.field_2._M_allocated_capacity._0_2_ = 0x5d;
      local_90._M_string_length = 1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      match(in_RSI,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      TreeNode::appendChild((TreeNode *)uVar7,(NodePtr *)local_f8);
      _Var6._M_pi = extraout_RDX_04;
LAB_0011790c:
      if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        _Var6._M_pi = extraout_RDX_06;
      }
    }
    else {
      token::getVal_abi_cxx11_
                ((string *)local_f8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar5 = std::__cxx11::string::compare(local_f8);
      if ((TreeNode *)local_f8._0_8_ != (TreeNode *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      if (iVar5 == 0) {
        local_f8._0_4_ = 9;
        TreeNode::setKind((TreeNode *)uVar7,(int *)local_f8);
        arg_list((analysis *)local_f8);
        TreeNode::appendChild((TreeNode *)uVar7,(NodePtr *)local_f8);
        _Var6._M_pi = extraout_RDX_05;
        goto LAB_0011790c;
      }
      local_f8._0_4_ = 0xf;
      TreeNode::setKind((TreeNode *)uVar7,(int *)local_f8);
      _Var6._M_pi = extraout_RDX_02;
    }
    uVar7 = local_118._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_118 + 0x10)) goto LAB_0011765c;
  }
  else {
    local_a0._M_allocated_capacity._0_2_ = 0x28;
    local_b0._8_8_ = 1;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    match(in_RSI,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity);
    }
    assignment_expr((analysis *)local_118);
    uVar3 = local_118._8_8_;
    uVar7 = local_118._0_8_;
    local_118._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    uVar2 = local_118._0_8_;
    local_118._8_8_ = (element_type *)0x0;
    peVar1 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_118._0_4_ = (undefined4)uVar7;
    local_118[4] = SUB81(uVar7,4);
    local_118._5_3_ = SUB83(uVar7,5);
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_118._0_8_ = uVar2;
    if (peVar1 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
    }
    if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    local_c0._M_allocated_capacity._0_2_ = 0x29;
    local_d0._8_8_ = (element_type *)0x1;
    local_d0._M_allocated_capacity = (size_type)&local_c0;
    match(in_RSI,(string *)&local_d0);
    _Var6._M_pi = extraout_RDX_03;
    uVar7 = local_d0._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_allocated_capacity == &local_c0) goto LAB_0011765c;
  }
  operator_delete((void *)uVar7);
  _Var6._M_pi = extraout_RDX_07;
LAB_0011765c:
  NVar9.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  NVar9.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar9.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::primary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in primary_expr\n";
#endif
	NodePtr ret;

	int lineno = tmp->getLineno();
	if ( tmp->getType() == TYPE::NUMINT)
	{
		int tmp_int = numberInteger();
		ret = ::std::make_shared<TreeNode>(tmp_int,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::INTLITERAL);
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getType() == TYPE::NUMFLOAT)
	{
		float tmp_float = numberFloat();
		ret = ::std::make_shared<TreeNode>(tmp_float,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::FLOATLITERAL);
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getType() == TYPE::NUMBOOLEAN || tmp->getType() == TYPE::STRING)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),lineno);

		if ( tmp->getType() == TYPE::NUMBOOLEAN){
			ret->setType(TypeKind::BoolK);
			ret->setKind(ExprKind::BOOLLITERAL);
		} else 
		{
			ret->setType(TypeKind::StringK);
			ret->setKind(ExprKind::STRINGLITERAL);
		}
		match(tmp->getVal());
		ret->setNodeKind(NodeKind::ExprK);
	} else if ( tmp->getType() == TYPE::ID)
	{
		::std::string tmp_str = identifier();

		ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
		ret->setNodeKind(NodeKind::ExprK);

		if ( tmp->getVal() == "[")
		{
			match("[");
			ret->setKind(ExprKind::ArrayExp);
			NodePtr tmp_ptr = expr();
			match("]");
			ret->appendChild(tmp_ptr);
		} else if ( tmp->getVal() == "(")
		{
			ret->setKind(ExprKind::FuncExp);
			NodePtr tmp_ptr = arg_list();
			ret->appendChild(tmp_ptr);
		} else 
		{
			ret->setKind(ExprKind::IdK);
		}
	} else 
	{
		match("(");
		ret = expr();
		match(")");
	}

	return ret;
}